

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_text_undo_record * nk_textedit_create_undo_record(nk_text_undo_state *state,int numchars)

{
  short sVar1;
  int numchars_local;
  nk_text_undo_state *state_local;
  
  nk_textedit_flush_redo(state);
  if (state->undo_point == 99) {
    nk_textedit_discard_undo(state);
  }
  if (numchars < 1000) {
    while (999 < state->undo_char_point + numchars) {
      nk_textedit_discard_undo(state);
    }
    sVar1 = state->undo_point;
    state->undo_point = sVar1 + 1;
    state_local = (nk_text_undo_state *)(state->undo_rec + sVar1);
  }
  else {
    state->undo_point = 0;
    state->undo_char_point = 0;
    state_local = (nk_text_undo_state *)0x0;
  }
  return state_local->undo_rec;
}

Assistant:

NK_INTERN struct nk_text_undo_record*
nk_textedit_create_undo_record(struct nk_text_undo_state *state, int numchars)
{
    /* any time we create a new undo record, we discard redo*/
    nk_textedit_flush_redo(state);

    /* if we have no free records, we have to make room,
     * by sliding the existing records down */
    if (state->undo_point == NK_TEXTEDIT_UNDOSTATECOUNT)
        nk_textedit_discard_undo(state);

    /* if the characters to store won't possibly fit in the buffer,
     * we can't undo */
    if (numchars > NK_TEXTEDIT_UNDOCHARCOUNT) {
        state->undo_point = 0;
        state->undo_char_point = 0;
        return 0;
    }

    /* if we don't have enough free characters in the buffer,
     * we have to make room */
    while (state->undo_char_point + numchars > NK_TEXTEDIT_UNDOCHARCOUNT)
        nk_textedit_discard_undo(state);
    return &state->undo_rec[state->undo_point++];
}